

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

void Gia_ManPrintCone2(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  uint uVar1;
  int v;
  Vec_Int_t *vNodes;
  Gia_Obj_t *pObj_00;
  int i;
  
  vNodes = Vec_IntAlloc(100);
  Gia_ManPrintCollect2_rec(p,pObj,vNodes);
  uVar1 = Gia_ObjId(p,pObj);
  printf("GIA logic cone for node %d:\n",(ulong)uVar1);
  for (i = 0; i < vNodes->nSize; i = i + 1) {
    v = Vec_IntEntry(vNodes,i);
    pObj_00 = Gia_ManObj(p,v);
    if (pObj_00 == (Gia_Obj_t *)0x0) break;
    Gia_ObjPrint(p,pObj_00);
  }
  Vec_IntFree(vNodes);
  return;
}

Assistant:

void Gia_ManPrintCone2( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    Vec_Int_t * vNodes;
    int i;
    vNodes = Vec_IntAlloc( 100 );
    Gia_ManPrintCollect2_rec( p, pObj, vNodes );
    printf( "GIA logic cone for node %d:\n", Gia_ObjId(p, pObj) );
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
        Gia_ObjPrint( p, pObj );
    Vec_IntFree( vNodes );
}